

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http.c++
# Opt level: O0

Promise<kj::HttpInputStream::Request> __thiscall
kj::anon_unknown_31::HttpInputStreamImpl::readRequest(HttpInputStreamImpl *this)

{
  PromiseNode *extraout_RDX;
  Promise<kj::HttpInputStream::Request> PVar1;
  PropagateException local_30 [8];
  HttpInputStreamImpl *this_local;
  
  this_local = this;
  readRequestHeaders((HttpInputStreamImpl *)&stack0xffffffffffffffd8);
  Promise<kj::Maybe<kj::HttpHeaders::Request>>::
  then<kj::(anonymous_namespace)::HttpInputStreamImpl::readRequest()::_lambda(kj::Maybe<kj::HttpHeaders::Request>&&)_1_,kj::_::PropagateException>
            ((Promise<kj::Maybe<kj::HttpHeaders::Request>> *)this,(Type *)&stack0xffffffffffffffd8,
             local_30);
  Promise<kj::Maybe<kj::HttpHeaders::Request>_>::~Promise
            ((Promise<kj::Maybe<kj::HttpHeaders::Request>_> *)&stack0xffffffffffffffd8);
  PVar1.super_PromiseBase.node.ptr = extraout_RDX;
  PVar1.super_PromiseBase.node.disposer = (Disposer *)this;
  return (Promise<kj::HttpInputStream::Request>)PVar1.super_PromiseBase.node;
}

Assistant:

kj::Promise<Request> readRequest() override {
    return readRequestHeaders()
        .then([this](kj::Maybe<HttpHeaders::Request>&& maybeRequest) -> HttpInputStream::Request {
      auto request = KJ_REQUIRE_NONNULL(maybeRequest, "bad request");
      auto body = getEntityBody(HttpInputStreamImpl::REQUEST, request.method, 0, headers);

      return { request.method, request.url, headers, kj::mv(body) };
    });
  }